

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

float get_color(int c,int x,int max)

{
  int in_EDX;
  int in_ESI;
  int in_EDI;
  float fVar1;
  double dVar2;
  double dVar3;
  float r;
  int j;
  int i;
  float ratio;
  float colors [6] [3];
  float local_58 [19];
  int local_c;
  int local_8;
  int local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  memcpy(local_58,&DAT_001385e0,0x48);
  fVar1 = ((float)local_8 / (float)local_c) * 5.0;
  dVar2 = floor((double)fVar1);
  dVar3 = ceil((double)fVar1);
  fVar1 = fVar1 - (float)(int)dVar2;
  return (1.0 - fVar1) * local_58[(long)(int)dVar2 * 3 + (long)local_4] +
         fVar1 * local_58[(long)(int)dVar3 * 3 + (long)local_4];
}

Assistant:

static float get_color(int c, int x, int max)
{
    float colors[6][3] = { {1,0,1}, {0,0,1}, {0,1,1}, {0,1,0}, {1,1,0}, {1,0,0} };
    float ratio = ((float)x/max)*5;
    int i = floor(ratio);
    int j = ceil(ratio);
    ratio -= i;
    float r = (1-ratio) * colors[i][c] + ratio*colors[j][c];
    return r;
}